

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-2.c
# Opt level: O0

int feederBig2(void)

{
  FILE *__stream;
  size_t sVar1;
  int T;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",2000);
    fprintf(__stream,"1346269\n");
    genTree((FILE *)__stream,0x1e,0,4000000);
    fprintf(__stream,"\n");
    fclose(__stream);
    sVar1 = GetLabPointerSize();
    LabMemoryLimit = (sVar1 * 2 + 8) * 0x148add + 0x400000;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int T = 2000;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", T);
    fprintf(in, "1346269\n");
    genTree(in, 30, 0, 4000000);
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 1346269*(sizeof(int)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}